

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

Pos getLinkedGatewayChunk(EndNoise *en,SurfaceNoise *sn,uint64_t seed,Pos src,Pos *dst)

{
  Pos PVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 in_RCX;
  int *in_R8;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int qz_1;
  int qx_1;
  int qz;
  int qx;
  int i;
  double pz;
  double px;
  double dz;
  double dx;
  double invr;
  Pos c;
  int in_stack_00000470;
  int in_stack_00000474;
  uint64_t in_stack_00000478;
  SurfaceNoise *in_stack_00000480;
  EndNoise *in_stack_00000488;
  int local_5c;
  double local_58;
  double local_50;
  int local_10;
  int iStack_c;
  int local_8;
  int iStack_4;
  
  local_10 = (int)in_RCX;
  iStack_c = (int)((ulong)in_RCX >> 0x20);
  dVar5 = sqrt((double)(local_10 * local_10 + iStack_c * iStack_c));
  dVar6 = (double)local_10 * (1.0 / dVar5);
  dVar5 = (double)iStack_c * (1.0 / dVar5);
  local_50 = dVar6 * 1024.0;
  local_58 = dVar5 * 1024.0;
  dVar6 = dVar6 * 16.0;
  dVar5 = dVar5 * 16.0;
  dVar7 = floor(local_50);
  local_8 = (int)dVar7 >> 4;
  dVar7 = floor(local_58);
  iStack_4 = (int)dVar7 >> 4;
  iVar2 = isEndChunkEmpty(in_stack_00000488,in_stack_00000480,in_stack_00000478,in_stack_00000474,
                          in_stack_00000470);
  if (iVar2 == 0) {
    for (local_5c = 0; local_5c < 0xf; local_5c = local_5c + 1) {
      local_50 = local_50 - dVar6;
      dVar7 = floor(local_50);
      local_58 = local_58 - dVar5;
      dVar8 = floor(local_58);
      iVar2 = isEndChunkEmpty(in_stack_00000488,in_stack_00000480,in_stack_00000478,
                              in_stack_00000474,in_stack_00000470);
      if (iVar2 != 0) break;
      local_8 = (int)dVar7 >> 4;
      iStack_4 = (int)dVar8 >> 4;
    }
  }
  else {
    for (local_5c = 0; local_5c < 0xf; local_5c = local_5c + 1) {
      local_50 = dVar6 + local_50;
      dVar7 = floor(local_50);
      iVar2 = (int)dVar7 >> 4;
      local_58 = dVar5 + local_58;
      dVar7 = floor(local_58);
      iVar3 = (int)dVar7 >> 4;
      if (((iVar2 != local_8) || (iVar3 != iStack_4)) &&
         (iVar4 = isEndChunkEmpty(in_stack_00000488,in_stack_00000480,in_stack_00000478,
                                  in_stack_00000474,in_stack_00000470), local_8 = iVar2,
         iStack_4 = iVar3, iVar4 == 0)) break;
    }
  }
  if (in_R8 != (int *)0x0) {
    dVar5 = floor(local_50);
    *in_R8 = (int)dVar5;
    dVar5 = floor(local_58);
    in_R8[1] = (int)dVar5;
  }
  PVar1.z = iStack_4;
  PVar1.x = local_8;
  return PVar1;
}

Assistant:

Pos getLinkedGatewayChunk(const EndNoise *en, const SurfaceNoise *sn, uint64_t seed,
    Pos src, Pos *dst)
{
    double invr = 1.0 / sqrt(src.x * src.x + src.z * src.z);
    double dx = src.x * invr;
    double dz = src.z * invr;
    double px = dx * 1024;
    double pz = dz * 1024;
    dx *= 16;
    dz *= 16;

    int i;
    Pos c;
    c.x = (int) floor(px) >> 4;
    c.z = (int) floor(pz) >> 4;

    if (isEndChunkEmpty(en, sn, seed, c.x, c.z))
    {   // look forward for the first non-empty chunk
        for (i = 0; i < 15; i++)
        {
            int qx = (int) floor(px += dx) >> 4;
            int qz = (int) floor(pz += dz) >> 4;
            if (qx == c.x && qz == c.z)
                continue;
            c.x = qx;
            c.z = qz;
            if (!isEndChunkEmpty(en, sn, seed, c.x, c.z))
                break;
        }
    }
    else
    {   // look backward for the last non-empty chunk
        for (i = 0; i < 15; i++)
        {
            int qx = (int) floor(px -= dx) >> 4;
            int qz = (int) floor(pz -= dz) >> 4;
            if (isEndChunkEmpty(en, sn, seed, qx, qz))
                break;
            c.x = qx;
            c.z = qz;
        }
    }
    if (dst)
    {
        dst->x = (int) floor(px);
        dst->z = (int) floor(pz);
    }
    return c;
}